

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int parse_http_response(char *buf,int len,mg_response_info *ri)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  bool bVar4;
  long l;
  char *tmp2;
  char *tmp;
  int init_skip;
  int response_length;
  mg_response_info *ri_local;
  byte *pbStack_18;
  int len_local;
  char *buf_local;
  
  tmp._0_4_ = 0;
  ri->status_text = (char *)0x0;
  ri->http_version = (char *)0x0;
  ri->status_code = 0;
  ri->num_headers = 0;
  _init_skip = ri;
  ri_local._4_4_ = len;
  pbStack_18 = (byte *)buf;
  while( true ) {
    bVar4 = false;
    if (0 < ri_local._4_4_) {
      ppuVar2 = __ctype_b_loc();
      bVar4 = ((*ppuVar2)[(int)(uint)*pbStack_18] & 0x2000) != 0;
    }
    if (!bVar4) break;
    pbStack_18 = pbStack_18 + 1;
    ri_local._4_4_ = ri_local._4_4_ + -1;
    tmp._0_4_ = (int)tmp + 1;
  }
  if (ri_local._4_4_ == 0) {
    buf_local._4_4_ = 0;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)(uint)*pbStack_18] & 2) == 0) {
      tmp._4_4_ = get_http_header_len((char *)pbStack_18,ri_local._4_4_);
      buf_local._4_4_ = tmp._4_4_;
      if (0 < tmp._4_4_) {
        pbStack_18[tmp._4_4_ + -1] = 0;
        if (((*pbStack_18 == 0) || (*pbStack_18 == 0xd)) || (*pbStack_18 == 10)) {
          buf_local._4_4_ = -1;
        }
        else {
          iVar1 = strncmp((char *)pbStack_18,"HTTP/",5);
          if (iVar1 == 0) {
            pbStack_18 = pbStack_18 + 5;
            ppuVar2 = __ctype_b_loc();
            if (((*ppuVar2)[(int)(uint)*pbStack_18] & 0x8000) == 0) {
              buf_local._4_4_ = -1;
            }
            else {
              _init_skip->http_version = (char *)pbStack_18;
              iVar1 = skip_to_end_of_word_and_terminate((char **)&stack0xffffffffffffffe8,0);
              if (iVar1 < 1) {
                buf_local._4_4_ = -1;
              }
              else {
                tmp2 = (char *)pbStack_18;
                iVar1 = skip_to_end_of_word_and_terminate((char **)&stack0xffffffffffffffe8,0);
                if (iVar1 < 1) {
                  buf_local._4_4_ = -1;
                }
                else {
                  lVar3 = strtol(tmp2,(char **)&l,10);
                  if (((lVar3 < 100) || (999 < lVar3)) ||
                     ((l - (long)tmp2 != 3 || (*(char *)l != '\0')))) {
                    buf_local._4_4_ = -1;
                  }
                  else {
                    _init_skip->status_code = (int)lVar3;
                    _init_skip->status_text = (char *)pbStack_18;
                    while (ppuVar2 = __ctype_b_loc(),
                          ((*ppuVar2)[(int)(uint)*pbStack_18] & 0x4000) != 0) {
                      pbStack_18 = pbStack_18 + 1;
                    }
                    if ((*pbStack_18 == 0xd) || (*pbStack_18 == 10)) {
                      do {
                        *pbStack_18 = 0;
                        pbStack_18 = pbStack_18 + 1;
                        ppuVar2 = __ctype_b_loc();
                      } while (((*ppuVar2)[(int)(uint)*pbStack_18] & 0x2000) != 0);
                      iVar1 = parse_http_headers((char **)&stack0xffffffffffffffe8,
                                                 _init_skip->http_headers);
                      _init_skip->num_headers = iVar1;
                      if (_init_skip->num_headers < 0) {
                        buf_local._4_4_ = -1;
                      }
                      else {
                        buf_local._4_4_ = tmp._4_4_ + (int)tmp;
                      }
                    }
                    else {
                      buf_local._4_4_ = -1;
                    }
                  }
                }
              }
            }
          }
          else {
            buf_local._4_4_ = -1;
          }
        }
      }
    }
    else {
      buf_local._4_4_ = -1;
    }
  }
  return buf_local._4_4_;
}

Assistant:

static int
parse_http_response(char *buf, int len, struct mg_response_info *ri)
{
	int response_length;
	int init_skip = 0;
	char *tmp, *tmp2;
	long l;

	/* Initialize elements. */
	ri->http_version = ri->status_text = NULL;
	ri->num_headers = ri->status_code = 0;

	/* RFC says that all initial whitespaces should be ignored */
	/* This included all leading \r and \n (isspace) */
	/* See table: http://www.cplusplus.com/reference/cctype/ */
	while ((len > 0) && isspace((unsigned char)*buf)) {
		buf++;
		len--;
		init_skip++;
	}

	if (len == 0) {
		/* Incomplete request */
		return 0;
	}

	/* Control characters are not allowed, including zero */
	if (iscntrl((unsigned char)*buf)) {
		return -1;
	}

	/* Find end of HTTP header */
	response_length = get_http_header_len(buf, len);
	if (response_length <= 0) {
		return response_length;
	}
	buf[response_length - 1] = '\0';

	if ((*buf == 0) || (*buf == '\r') || (*buf == '\n')) {
		return -1;
	}

	/* The first word is the HTTP version */
	/* Check for a valid HTTP version key */
	if (strncmp(buf, "HTTP/", 5) != 0) {
		/* Invalid request */
		return -1;
	}
	buf += 5;
	if (!isgraph((unsigned char)buf[0])) {
		/* Invalid request */
		return -1;
	}
	ri->http_version = buf;

	if (skip_to_end_of_word_and_terminate(&buf, 0) <= 0) {
		return -1;
	}

	/* The second word is the status as a number */
	tmp = buf;

	if (skip_to_end_of_word_and_terminate(&buf, 0) <= 0) {
		return -1;
	}

	l = strtol(tmp, &tmp2, 10);
	if ((l < 100) || (l >= 1000) || ((tmp2 - tmp) != 3) || (*tmp2 != 0)) {
		/* Everything else but a 3 digit code is invalid */
		return -1;
	}
	ri->status_code = (int)l;

	/* The rest of the line is the status text */
	ri->status_text = buf;

	/* Find end of status text */
	/* isgraph or isspace = isprint */
	while (isprint((unsigned char)*buf)) {
		buf++;
	}
	if ((*buf != '\r') && (*buf != '\n')) {
		return -1;
	}
	/* Terminate string and forward buf to next line */
	do {
		*buf = 0;
		buf++;
	} while (isspace((unsigned char)*buf));

	/* Parse all HTTP headers */
	ri->num_headers = parse_http_headers(&buf, ri->http_headers);
	if (ri->num_headers < 0) {
		/* Error while parsing headers */
		return -1;
	}

	return response_length + init_skip;
}